

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O2

string * utilModelStatusToString_abi_cxx11_
                   (string *__return_storage_ptr__,HighsModelStatus model_status)

{
  char *pcVar1;
  allocator local_9;
  
  switch(model_status) {
  case kMin:
    pcVar1 = "Not Set";
    break;
  case kLoadError:
    pcVar1 = "Load error";
    break;
  case kModelError:
    pcVar1 = "Model error";
    break;
  case kPresolveError:
    pcVar1 = "Presolve error";
    break;
  case kSolveError:
    pcVar1 = "Solve error";
    break;
  case kPostsolveError:
    pcVar1 = "Postsolve error";
    break;
  case kModelEmpty:
    pcVar1 = "Empty";
    break;
  case kOptimal:
    pcVar1 = "Optimal";
    break;
  case kInfeasible:
    pcVar1 = "Infeasible";
    break;
  case kUnboundedOrInfeasible:
    pcVar1 = "Primal infeasible or unbounded";
    break;
  case kUnbounded:
    pcVar1 = "Unbounded";
    break;
  case kObjectiveBound:
    pcVar1 = "Bound on objective reached";
    break;
  case kObjectiveTarget:
    pcVar1 = "Target for objective reached";
    break;
  case kTimeLimit:
    pcVar1 = "Time limit reached";
    break;
  case kIterationLimit:
    pcVar1 = "Iteration limit reached";
    break;
  case kUnknown:
    pcVar1 = "Unknown";
    break;
  case kSolutionLimit:
    pcVar1 = "Solution limit reached";
    break;
  case kInterrupt:
    pcVar1 = "Interrupted by user";
    break;
  case kMax:
    pcVar1 = "Memory limit reached";
    break;
  default:
    pcVar1 = "Unrecognised HiGHS model status";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string utilModelStatusToString(const HighsModelStatus model_status) {
  switch (model_status) {
    case HighsModelStatus::kNotset:
      return "Not Set";
      break;
    case HighsModelStatus::kLoadError:
      return "Load error";
      break;
    case HighsModelStatus::kModelError:
      return "Model error";
      break;
    case HighsModelStatus::kPresolveError:
      return "Presolve error";
      break;
    case HighsModelStatus::kSolveError:
      return "Solve error";
      break;
    case HighsModelStatus::kPostsolveError:
      return "Postsolve error";
      break;
    case HighsModelStatus::kModelEmpty:
      return "Empty";
      break;
    case HighsModelStatus::kMemoryLimit:
      return "Memory limit reached";
      break;
    case HighsModelStatus::kOptimal:
      return "Optimal";
      break;
    case HighsModelStatus::kInfeasible:
      return "Infeasible";
      break;
    case HighsModelStatus::kUnboundedOrInfeasible:
      return "Primal infeasible or unbounded";
      break;
    case HighsModelStatus::kUnbounded:
      return "Unbounded";
      break;
    case HighsModelStatus::kObjectiveBound:
      return "Bound on objective reached";
      break;
    case HighsModelStatus::kObjectiveTarget:
      return "Target for objective reached";
      break;
    case HighsModelStatus::kTimeLimit:
      return "Time limit reached";
      break;
    case HighsModelStatus::kIterationLimit:
      return "Iteration limit reached";
      break;
    case HighsModelStatus::kSolutionLimit:
      return "Solution limit reached";
      break;
    case HighsModelStatus::kInterrupt:
      return "Interrupted by user";
      break;
    case HighsModelStatus::kUnknown:
      return "Unknown";
      break;
    default:
      assert(1 == 0);
      return "Unrecognised HiGHS model status";
  }
}